

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall
qpdf::Array::setFromVector
          (Array *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v)

{
  pointer pQVar1;
  QPDF_Array *pQVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  QPDFObjectHandle *item;
  pointer item_00;
  
  pQVar2 = array(this);
  this_00 = &pQVar2->elements;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize(this_00,0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
            (this_00,(long)(v->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4);
  pQVar1 = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (item_00 = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_start; item_00 != pQVar1; item_00 = item_00 + 1)
  {
    checkOwnership(this,item_00);
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
    emplace_back<QPDFObjectHandle_const&>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)this_00,item_00);
  }
  return;
}

Assistant:

void
Array::setFromVector(std::vector<QPDFObjectHandle> const& v)
{
    auto a = array();
    a->elements.resize(0);
    a->elements.reserve(v.size());
    for (auto const& item: v) {
        checkOwnership(item);
        a->elements.emplace_back(item);
    }
}